

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O0

void grd_worker(job_t *job,uint32_t id,uint32_t cnt,grd_st_t *grd_st)

{
  uint32_t *pos_00;
  _Bool _Var1;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  bool bVar2;
  bool bVar3;
  uint32_t s;
  uint32_t pos;
  uint32_t count;
  dat_t *dat;
  mdl_t *mdl;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 uVar4;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  job_t *job_00;
  
  uVar4 = in_ESI != 0 && in_EDX != 0;
  job_00 = *(job_t **)(*in_RCX + 0x40);
  in_RCX[3] = 0;
  do {
    pos_00 = (uint32_t *)
             CONCAT44(in_stack_ffffffffffffffcc,
                      CONCAT13(uVar4,CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)))
    ;
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffd0;
    _Var1 = mth_getjob(job_00,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),pos_00);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffcc;
    if (!_Var1) {
      return;
    }
    for (; bVar3 = (uit_stop & 1U) == 0,
        bVar2 = in_stack_ffffffffffffffcc < in_stack_ffffffffffffffd0 + in_stack_ffffffffffffffd4,
        in_stack_ffffffffffffffca = bVar3 && bVar2, bVar3 && bVar2;
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
      grd_dospl((grd_st_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                (seq_t *)CONCAT44(in_stack_ffffffffffffffcc,
                                  CONCAT13(uVar4,CONCAT12(in_stack_ffffffffffffffca,
                                                          in_stack_ffffffffffffffc8))));
    }
  } while ((uit_stop & 1U) == 0);
  return;
}

Assistant:

static
void grd_worker(job_t *job, uint32_t id, uint32_t cnt, grd_st_t *grd_st) {
	unused(id && cnt);
	mdl_t *mdl = grd_st->mdl;
	const dat_t *dat = mdl->train;
	// We first cleanup the gradient and value as our parent don't do it (it
	// is better to do this also in parallel)
	grd_st->lloss = 0.0;
#ifdef ATM_ANSI
	const uint64_t F = mdl->nftr;
	for (uint64_t f = 0; f < F; f++)
		grd_st->g[f] = 0.0;
#endif
	// Now all is ready, we can process our sequences and accumulate the
	// gradient and inverse log-likelihood
	uint32_t count, pos;
	while (mth_getjob(job, &count, &pos)) {
		for (uint32_t s = pos; !uit_stop && s < pos + count; s++)
			grd_dospl(grd_st, dat->seq[s]);
		if (uit_stop)
			break;
	}
}